

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psfont.c
# Opt level: O0

FT_Error cf2_getGlyphOutline(CF2_Font font,CF2_Buffer charstring,CF2_Matrix *transform,
                            CF2_F16Dot16 *glyphWidth)

{
  FT_Bool local_45;
  CF2_F16Dot16 local_44;
  undefined1 auStack_40 [3];
  FT_Bool needWinding;
  CF2_F16Dot16 advWidth;
  FT_Vector translation;
  FT_Error lastError;
  CF2_F16Dot16 *glyphWidth_local;
  CF2_Matrix *transform_local;
  CF2_Buffer charstring_local;
  CF2_Font font_local;
  
  translation.y._4_4_ = 0;
  local_44 = 0;
  _auStack_40 = (long)transform->tx;
  translation.x = (FT_Pos)transform->ty;
  cf2_font_setup(font,transform);
  if (font->error == 0) {
    font->reverseWinding = '\0';
    local_45 = font->darkened;
    while( true ) {
      cf2_outline_reset(&font->outline);
      cf2_interpT2CharString
                (font,charstring,&(font->outline).root,(FT_Vector *)auStack_40,'\0',0,0,&local_44);
      if (font->error != 0) break;
      if ((local_45 == '\0') || (-1 < (font->outline).root.windingMomentum)) {
        cf2_outline_close(&font->outline);
        break;
      }
      font->reverseWinding = '\x01';
      local_45 = '\0';
    }
  }
  *glyphWidth = local_44;
  cf2_setError(&font->error,translation.y._4_4_);
  return font->error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getGlyphOutline( CF2_Font           font,
                       CF2_Buffer         charstring,
                       const CF2_Matrix*  transform,
                       CF2_F16Dot16*      glyphWidth )
  {
    FT_Error  lastError = FT_Err_Ok;

    FT_Vector  translation;

#if 0
    FT_Vector  advancePoint;
#endif

    CF2_Fixed  advWidth = 0;
    FT_Bool    needWinding;


    /* Note: use both integer and fraction for outlines.  This allows bbox */
    /*       to come out directly.                                         */

    translation.x = transform->tx;
    translation.y = transform->ty;

    /* set up values based on transform */
    cf2_font_setup( font, transform );
    if ( font->error )
      goto exit;                      /* setup encountered an error */

    /* reset darken direction */
    font->reverseWinding = FALSE;

    /* winding order only affects darkening */
    needWinding = font->darkened;

    while ( 1 )
    {
      /* reset output buffer */
      cf2_outline_reset( &font->outline );

      /* build the outline, passing the full translation */
      cf2_interpT2CharString( font,
                              charstring,
                              (CF2_OutlineCallbacks)&font->outline,
                              &translation,
                              FALSE,
                              0,
                              0,
                              &advWidth );

      if ( font->error )
        goto exit;

      if ( !needWinding )
        break;

      /* check winding order */
      if ( font->outline.root.windingMomentum >= 0 ) /* CFF is CCW */
        break;

      /* invert darkening and render again                            */
      /* TODO: this should be a parameter to getOutline-computeOffset */
      font->reverseWinding = TRUE;

      needWinding = FALSE;    /* exit after next iteration */
    }

    /* finish storing client outline */
    cf2_outline_close( &font->outline );

  exit:
    /* FreeType just wants the advance width; there is no translation */
    *glyphWidth = advWidth;

    /* free resources and collect errors from objects we've used */
    cf2_setError( &font->error, lastError );

    return font->error;
  }